

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void osgen_delete_win(osgen_win_t *win)

{
  osgen_win_t **ppoVar1;
  osgen_win_t *poVar2;
  osgen_win_t *poVar3;
  osgen_win_t **ppoVar4;
  
  if (win->parent != (osgen_win_t *)0x0) {
    ppoVar1 = &win->parent->first_child;
    poVar2 = (osgen_win_t *)0x0;
    ppoVar4 = ppoVar1;
    do {
      poVar3 = poVar2;
      poVar2 = *ppoVar4;
      if (poVar2 == (osgen_win_t *)0x0) break;
      ppoVar4 = &poVar2->nxt;
    } while (poVar2 != win);
    if (poVar2 != (osgen_win_t *)0x0) {
      ppoVar4 = &poVar3->nxt;
      if (poVar3 == (osgen_win_t *)0x0) {
        ppoVar4 = ppoVar1;
      }
      *ppoVar4 = win->nxt;
    }
  }
  for (poVar2 = win->first_child; poVar2 != (osgen_win_t *)0x0; poVar2 = poVar2->nxt) {
    poVar2->parent = (osgen_win_t *)0x0;
  }
  if (win->win_type == 2) {
    if (win[1].parent != (osgen_win_t *)0x0) {
      free(win[1].parent);
    }
    poVar2 = win[1].first_child;
  }
  else {
    if (win->win_type != 1) goto LAB_001ebb2e;
    if (win[1].parent != (osgen_win_t *)0x0) {
      free(win[1].parent);
    }
    poVar2 = *(osgen_win_t **)&win[1].size;
  }
  if (poVar2 != (osgen_win_t *)0x0) {
    free(poVar2);
  }
LAB_001ebb2e:
  free(win);
  return;
}

Assistant:

static void osgen_delete_win(osgen_win_t *win)
{
    osgen_win_t *prv;
    osgen_win_t *cur;
    osgen_txtwin_t *twin;
    osgen_gridwin_t *gwin;

    /* if we have a parent, remove ourselves from our parent's child list */
    if (win->parent != 0)
    {
        /* scan our parent's child list */
        for (prv = 0, cur = win->parent->first_child ;
             cur != 0 && cur != win ;
             prv = cur, cur = cur->nxt) ;

        /* if we found it, unlink it */
        if (cur != 0)
        {
            /* set the previous item's forward pointer */
            if (prv == 0)
                win->parent->first_child = win->nxt;
            else
                prv->nxt = win->nxt;
        }
    }

    /* 
     *   Remove the parent reference from each child of this window.  We're
     *   going to be deleted, so we can't keep references from our children
     *   to us.  
     */
    for (cur = win->first_child ; cur != 0 ; cur = cur->nxt)
        cur->parent = 0;

    /* delete the window according to its type */
    switch(win->win_type)
    {
    case OS_BANNER_TYPE_TEXT:
        /* get the text window subclass data */
        twin = (osgen_txtwin_t *)win;

        /* delete its scrollback buffer, if it has one */
        if (twin->txtbuf != 0)
            osfree(twin->txtbuf);

        /* delete the line pointers */
        if (twin->line_ptr != 0)
            osfree(twin->line_ptr);
        break;

    case OS_BANNER_TYPE_TEXTGRID:
        /* get the grid window subclass data */
        gwin = (osgen_gridwin_t *)win;

        /* delete the character and color arrays */
        if (gwin->grid_txt != 0)
            osfree(gwin->grid_txt);
        if (gwin->grid_color != 0)
            osfree(gwin->grid_color);
        break;
    }

    /* delete the window itself */
    osfree(win);
}